

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_benchmark.cpp
# Opt level: O1

void print_stats(double result,double elapsed)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|   * result: ",0xe);
  poVar1 = std::ostream::_M_insert<double>(result);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|   * time: ",0xc);
  poVar1 = std::ostream::_M_insert<double>(elapsed);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  return;
}

Assistant:

inline void print_stats(double result, double elapsed)
{
  std::cout << "|" << std::endl;
  std::cout << "|   * result: " << result << std::endl;
  std::cout << "|   * time: " << elapsed << std::endl;
  std::cout << "|" << std::endl;
  std::cout << std::endl;
}